

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

void archive_string_conversion_free(archive *a)

{
  long in_RDI;
  archive_string_conv *sc_next;
  archive_string_conv *sc;
  undefined8 local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 0x68);
  while (local_10 != (undefined8 *)0x0) {
    local_10 = (undefined8 *)*local_10;
    free_sconv_object((archive_string_conv *)0x158df5);
  }
  *(undefined8 *)(in_RDI + 0x68) = 0;
  free(*(void **)(in_RDI + 0x58));
  *(undefined8 *)(in_RDI + 0x58) = 0;
  return;
}

Assistant:

void
archive_string_conversion_free(struct archive *a)
{
	struct archive_string_conv *sc; 
	struct archive_string_conv *sc_next; 

	for (sc = a->sconv; sc != NULL; sc = sc_next) {
		sc_next = sc->next;
		free_sconv_object(sc);
	}
	a->sconv = NULL;
	free(a->current_code);
	a->current_code = NULL;
}